

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O3

CURLcode pop3_connect(Curl_easy *data,_Bool *done)

{
  char *pcVar1;
  unsigned_short *sasl;
  short sVar2;
  connectdata *conn;
  char cVar3;
  int iVar4;
  CURLcode CVar5;
  uchar uVar6;
  char *value;
  size_t len;
  char *first;
  char *pcVar7;
  
  conn = data->conn;
  *done = false;
  Curl_conncontrol(conn,0);
  (conn->proto).smbc.send_buf = (char *)0x1d4c0;
  (conn->proto).ftpc.pp.statemachine = pop3_statemachine;
  (conn->proto).ftpc.pp.endofresp = pop3_endofresp;
  (conn->proto).pop3c.preftype = '\a';
  sasl = &(conn->proto).imapc.sasl.authmechs;
  Curl_sasl_init((SASL *)sasl,data,&saslpop3);
  Curl_pp_init(&(conn->proto).ftpc.pp);
  first = conn->options;
  if (first != (char *)0x0) {
    cVar3 = *first;
    while (pcVar7 = first, cVar3 != '\0') {
      while ((value = pcVar7 + 1, cVar3 != '\0' && (cVar3 != '='))) {
        pcVar7 = value;
        cVar3 = *value;
      }
      len = 0xffffffffffffffff;
      while ((cVar3 != '\0' && (cVar3 != ';'))) {
        pcVar1 = pcVar7 + 1;
        pcVar7 = pcVar7 + 1;
        len = len + 1;
        cVar3 = *pcVar1;
      }
      iVar4 = curl_strnequal(first,"AUTH=",5);
      if (iVar4 == 0) {
        CVar5 = CURLE_URL_MALFORMAT;
        goto LAB_001489e6;
      }
      CVar5 = Curl_sasl_parse_url_auth_option((SASL *)sasl,value,len);
      if (CVar5 != CURLE_OK) {
        iVar4 = curl_strnequal(value,"+APOP",len);
        if (iVar4 == 0) goto LAB_001489e6;
        (conn->proto).pop3c.preftype = '\x02';
        *(undefined2 *)((long)&conn->proto + 0xd2) = 0;
      }
      first = pcVar7 + (*pcVar7 == ';');
      cVar3 = pcVar7[*pcVar7 == ';'];
    }
  }
  CVar5 = CURLE_OK;
LAB_001489e6:
  if ((conn->proto).pop3c.preftype != '\x02') {
    sVar2 = *(short *)((long)&conn->proto + 0xd2);
    uVar6 = '\0';
    if (sVar2 != 0) {
      uVar6 = (sVar2 == -0x21) * '\x03' + '\x04';
    }
    (conn->proto).pop3c.preftype = uVar6;
  }
  if (CVar5 == CURLE_OK) {
    (data->conn->proto).pop3c.state = POP3_SERVERGREET;
    CVar5 = pop3_multi_statemach(data,done);
    return CVar5;
  }
  return CVar5;
}

Assistant:

static CURLcode pop3_connect(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  struct pingpong *pp = &pop3c->pp;

  *done = FALSE; /* default to not done yet */

  /* We always support persistent connections in POP3 */
  connkeep(conn, "POP3 default");

  PINGPONG_SETUP(pp, pop3_statemachine, pop3_endofresp);

  /* Set the default preferred authentication type and mechanism */
  pop3c->preftype = POP3_TYPE_ANY;
  Curl_sasl_init(&pop3c->sasl, data, &saslpop3);

  /* Initialise the pingpong layer */
  Curl_pp_init(pp);

  /* Parse the URL options */
  result = pop3_parse_url_options(conn);
  if(result)
    return result;

  /* Start off waiting for the server greeting response */
  pop3_state(data, POP3_SERVERGREET);

  result = pop3_multi_statemach(data, done);

  return result;
}